

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

void skiwi::skiwi_show_external_primitives(string *arg)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  int iVar6;
  string *psVar7;
  string txt;
  
  psVar1 = DAT_002b39b8;
  psVar7 = (anonymous_namespace)::external_primitives;
  do {
    if (psVar7 == psVar1) {
      return;
    }
    if (arg->_M_string_length == 0) {
LAB_001fd09c:
      if ((DAT_002b39a8 != (ostream *)0x0) &&
         (std::operator<<(DAT_002b39a8,"NAME\n"), DAT_002b39a8 != (ostream *)0x0)) {
        poVar3 = std::operator<<(DAT_002b39a8,"\t");
        poVar3 = std::operator<<(poVar3,psVar7);
        std::operator<<(poVar3,"\n");
      }
      if (*(long *)(psVar7 + 0x28) != 0) {
        std::__cxx11::string::string((string *)&txt,psVar7 + 0x20);
        iVar6 = 0;
        for (sVar5 = 0; txt._M_string_length != sVar5; sVar5 = sVar5 + 1) {
          if ((0x32 < iVar6) && (txt._M_dataplus._M_p[sVar5] == ' ')) {
            txt._M_dataplus._M_p[sVar5] = '\n';
            iVar6 = 0;
          }
          iVar6 = iVar6 + 1;
        }
        while (uVar4 = std::__cxx11::string::find((char *)&txt,0x25f155),
              uVar4 != 0xffffffffffffffff) {
          std::__cxx11::string::replace((ulong)&txt,uVar4,(char *)0x1);
        }
        if ((DAT_002b39a8 != (ostream *)0x0) &&
           (std::operator<<(DAT_002b39a8,"DESCRIPTION\n"), DAT_002b39a8 != (ostream *)0x0)) {
          poVar3 = std::operator<<(DAT_002b39a8,"\t");
          poVar3 = std::operator<<(poVar3,(string *)&txt);
          std::operator<<(poVar3,"\n\n");
        }
        std::__cxx11::string::~string((string *)&txt);
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&txt,(ulong)psVar7);
      bVar2 = std::operator!=(&txt,arg);
      std::__cxx11::string::~string((string *)&txt);
      if (!bVar2) goto LAB_001fd09c;
    }
    psVar7 = psVar7 + 0x40;
  } while( true );
}

Assistant:

void skiwi_show_external_primitives(const std::string& arg)
  {
  for (const auto& p : external_primitives)
    {
    if (!arg.empty())
      {
      if (p.name.substr(0, arg.length()) != arg)
        continue;
      }
    out("NAME\n");
    out("\t", p.name, "\n");
    if (!p.help_text.empty())
      {
      std::string txt = p.help_text;
      auto it = txt.begin();
      auto it_end = txt.end();
      int count = 0;
      for (; it != it_end; ++it, ++count)
        {
        if (count > 50 && *it == ' ')
          {
          count = 0;
          *it = '\n';
          }
        }
      size_t pos = txt.find("\n");
      while (pos != std::string::npos)
        {
        txt.replace(pos, 1, "\n\t");
        pos = txt.find("\n", pos + 2);
        }
      out("DESCRIPTION\n");
      out("\t", txt, "\n\n");
      }
    }
  }